

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack_parser.hpp
# Opt level: O2

void __thiscall
jsoncons::msgpack::basic_msgpack_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>
::basic_msgpack_parser<std::ifstream&>
          (basic_msgpack_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>> *this,
          basic_ifstream<char,_std::char_traits<char>_> *source,msgpack_decode_options *options,
          allocator<char> *alloc)

{
  int local_38 [2];
  
  *(undefined ***)this = &PTR__basic_msgpack_parser_00997208;
  *(undefined2 *)(this + 8) = 1;
  *(undefined4 *)(this + 0xc) = 0;
  this[0x10] = (basic_msgpack_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>)
               0x0;
  *(undefined4 *)(this + 0x14) = 0;
  stream_source<unsigned_char>::stream_source
            ((stream_source<unsigned_char> *)(this + 0x18),
             (basic_istream<char,_std::char_traits<char>_> *)source,0x4000);
  *(undefined4 *)(this + 0x1c0) =
       *(undefined4 *)(&options->field_0x8 + (long)options->_vptr_msgpack_decode_options[-3]);
  *(undefined8 *)(this + 0x1b0) = 0x997198;
  *(undefined8 *)(this + 0x1b8) = 0x9971c0;
  *(basic_msgpack_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>> **)
   (this + 0x1c8) = this + 0x1d8;
  *(undefined8 *)(this + 0x1d0) = 0;
  this[0x1d8] = (basic_msgpack_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>)
                0x0;
  *(undefined8 *)(this + 0x1e8) = 0;
  *(undefined8 *)(this + 0x1f0) = 0;
  *(undefined8 *)(this + 0x1f8) = 0;
  *(undefined8 *)(this + 0x200) = 0;
  *(undefined8 *)(this + 0x208) = 0;
  *(undefined8 *)(this + 0x210) = 0;
  local_38[0] = 0;
  local_38[1] = 0;
  std::vector<jsoncons::msgpack::parse_state,std::allocator<jsoncons::msgpack::parse_state>>::
  emplace_back<jsoncons::msgpack::parse_mode,int>
            ((vector<jsoncons::msgpack::parse_state,std::allocator<jsoncons::msgpack::parse_state>>
              *)(this + 0x200),(parse_mode *)(local_38 + 1),local_38);
  return;
}

Assistant:

basic_msgpack_parser(Sourceable&& source,
                         const msgpack_decode_options& options = msgpack_decode_options(),
                         const Allocator& alloc = Allocator())
       : source_(std::forward<Sourceable>(source)),
         options_(options),
         text_buffer_(alloc),
         bytes_buffer_(alloc),
         state_stack_(alloc)
    {
        state_stack_.emplace_back(parse_mode::root,0);
    }